

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

FileMetaData * __thiscall
leveldb::AddBoundaryInputsTest::CreateFileMetaData
          (AddBoundaryInputsTest *this,uint64_t number,InternalKey *smallest,InternalKey *largest)

{
  FileMetaData *this_00;
  FileMetaData *f;
  
  this_00 = (FileMetaData *)operator_new(0x58);
  FileMetaData::FileMetaData(this_00);
  this_00->number = number;
  f = this_00;
  std::__cxx11::string::_M_assign((string *)&this_00->smallest);
  std::__cxx11::string::_M_assign((string *)&this_00->largest);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (&this->all_files_,&f);
  return f;
}

Assistant:

FileMetaData* CreateFileMetaData(uint64_t number, InternalKey smallest,
                                   InternalKey largest) {
    FileMetaData* f = new FileMetaData();
    f->number = number;
    f->smallest = smallest;
    f->largest = largest;
    all_files_.push_back(f);
    return f;
  }